

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.hpp
# Opt level: O2

void __thiscall duckdb::BaseSecret::~BaseSecret(BaseSecret *this)

{
  ~BaseSecret(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~BaseSecret() = default;